

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shared_sbar.cpp
# Opt level: O1

void __thiscall DBaseStatusBar::DrSmallNumber(DBaseStatusBar *this,int val,int x,int y)

{
  int iVar1;
  int iVar2;
  FTexture *pFVar3;
  int iVar4;
  ulong uVar5;
  
  uVar5 = 999;
  if (val < 999) {
    uVar5 = (ulong)(uint)val;
  }
  iVar4 = (int)uVar5;
  if (val < 100) {
    if (iVar4 < 10) goto LAB_004d0dee;
  }
  else {
    pFVar3 = FImageCollection::operator[](&this->Images,(int)(uVar5 / 100) + 0x17);
    DrawImage(this,pFVar3,x,y,(FRemapTable *)0x0);
    iVar4 = iVar4 + (int)(uVar5 / 100) * -100;
  }
  iVar2 = iVar4 >> 0x1f;
  iVar1 = iVar4 / 10 + iVar2;
  pFVar3 = FImageCollection::operator[](&this->Images,(iVar1 - iVar2) + 0x17);
  DrawImage(this,pFVar3,x + 4,y,(FRemapTable *)0x0);
  iVar4 = iVar4 + (iVar1 - iVar2) * -10;
LAB_004d0dee:
  pFVar3 = FImageCollection::operator[](&this->Images,iVar4 + 0x17);
  DrawImage(this,pFVar3,x + 8,y,(FRemapTable *)0x0);
  return;
}

Assistant:

void DBaseStatusBar::DrSmallNumber (int val, int x, int y) const
{
	int digit = 0;

	if (val > 999)
	{
		val = 999;
	}
	if (val > 99)
	{
		digit = val / 100;
		DrawImage (Images[imgSmNumbers + digit], x, y);
		val -= digit * 100;
	}
	if (val > 9 || digit)
	{
		digit = val / 10;
		DrawImage (Images[imgSmNumbers + digit], x+4, y);
		val -= digit * 10;
	}
	DrawImage (Images[imgSmNumbers + val], x+8, y);
}